

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface6.c
# Opt level: O2

int run_test_udp_multicast_interface6(void)

{
  int iVar1;
  short *psVar2;
  uv_loop_t *puVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  undefined8 uStack_1a0;
  sockaddr_in6 addr;
  sockaddr_in6 baddr;
  uv_buf_t local_160;
  uv_udp_send_t req;
  
  iVar1 = uv_interface_addresses((uv_interface_address_t **)&req,(int *)&addr);
  if (iVar1 == 0) {
    psVar2 = (short *)((long)req.data + 0x14);
    bVar6 = false;
    for (lVar4 = 0; (!bVar6 && (lVar4 < (int)addr._0_4_)); lVar4 = lVar4 + 1) {
      bVar6 = *psVar2 == 10;
      psVar2 = psVar2 + 0x28;
    }
    uv_free_interface_addresses((uv_interface_address_t *)req.data,addr._0_4_);
    if (bVar6) {
      iVar1 = uv_ip6_addr("::1",0x23a3,&addr);
      if (iVar1 == 0) {
        puVar3 = uv_default_loop();
        iVar1 = uv_udp_init(puVar3,&server);
        if (iVar1 == 0) {
          iVar1 = uv_ip6_addr("::",0,&baddr);
          if (iVar1 == 0) {
            iVar1 = uv_udp_bind(&server,(sockaddr *)&baddr,0);
            if (iVar1 == 0) {
              iVar1 = uv_udp_set_multicast_interface(&server,(char *)0x0);
              if (iVar1 == 0) {
                local_160 = uv_buf_init("PING",4);
                iVar1 = uv_udp_send(&req,&server,&local_160,1,(sockaddr *)&addr,sv_send_cb);
                if (iVar1 == 0) {
                  if (close_cb_called == 0) {
                    if (sv_send_cb_called == 0) {
                      puVar3 = uv_default_loop();
                      uv_run(puVar3,UV_RUN_DEFAULT);
                      if (sv_send_cb_called == 1) {
                        if (close_cb_called == 1) {
                          puVar3 = uv_default_loop();
                          uv_walk(puVar3,close_walk_cb,(void *)0x0);
                          uv_run(puVar3,UV_RUN_DEFAULT);
                          puVar3 = uv_default_loop();
                          iVar1 = uv_loop_close(puVar3);
                          if (iVar1 == 0) {
                            uv_library_shutdown();
                            return 0;
                          }
                          pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                          uStack_1a0 = 0x6a;
                        }
                        else {
                          pcVar5 = "close_cb_called == 1";
                          uStack_1a0 = 0x68;
                        }
                      }
                      else {
                        pcVar5 = "sv_send_cb_called == 1";
                        uStack_1a0 = 0x67;
                      }
                    }
                    else {
                      pcVar5 = "sv_send_cb_called == 0";
                      uStack_1a0 = 0x62;
                    }
                  }
                  else {
                    pcVar5 = "close_cb_called == 0";
                    uStack_1a0 = 0x61;
                  }
                }
                else {
                  pcVar5 = "r == 0";
                  uStack_1a0 = 0x5f;
                }
              }
              else {
                pcVar5 = "r == 0";
                uStack_1a0 = 0x55;
              }
            }
            else {
              pcVar5 = "r == 0";
              uStack_1a0 = 0x4e;
            }
          }
          else {
            pcVar5 = "0 == uv_ip6_addr(\"::\", 0, &baddr)";
            uStack_1a0 = 0x4c;
          }
        }
        else {
          pcVar5 = "r == 0";
          uStack_1a0 = 0x4a;
        }
      }
      else {
        pcVar5 = "0 == uv_ip6_addr(\"::1\", TEST_PORT, &addr)";
        uStack_1a0 = 0x47;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,uStack_1a0,pcVar5);
      abort();
    }
  }
  fprintf(_stderr,"%s\n","IPv6 not supported");
  fflush(_stderr);
  return 1;
}

Assistant:

TEST_IMPL(udp_multicast_interface6) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in6 addr;
  struct sockaddr_in6 baddr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip6_addr("::", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__)
  r = uv_udp_set_multicast_interface(&server, "::1%lo0");
#else
  r = uv_udp_set_multicast_interface(&server, NULL);
#endif
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}